

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O1

void aom_calc_highbd_psnr
               (YV12_BUFFER_CONFIG *a,YV12_BUFFER_CONFIG *b,PSNR_STATS *psnr,uint32_t bit_depth,
               uint32_t in_bit_depth)

{
  int width;
  int height;
  uint64_t uVar1;
  int64_t iVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  undefined4 in_register_00000084;
  ulong uVar11;
  long lVar12;
  PSNR_STATS *pPVar13;
  YV12_BUFFER_CONFIG *pYVar14;
  uint64_t uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int b_strides [3];
  int a_strides [3];
  int heights [3];
  int widths [3];
  uint local_80 [12];
  undefined8 local_50;
  double local_48;
  YV12_BUFFER_CONFIG *local_40;
  PSNR_STATS *local_38;
  
  local_50 = CONCAT44(in_register_00000084,in_bit_depth);
  local_80[9] = (a->field_2).field_0.y_crop_width;
  local_80[10] = (a->field_2).field_0.uv_crop_width;
  local_80[0xb] = local_80[10];
  local_80[6] = (a->field_3).field_0.y_crop_height;
  local_80[7] = (a->field_3).field_0.uv_crop_height;
  local_80[8] = local_80[7];
  local_80[3] = (a->field_4).field_0.y_stride;
  local_80[4] = (a->field_4).field_0.uv_stride;
  local_80[5] = local_80[4];
  local_80[0] = (b->field_4).field_0.y_stride;
  local_80[1] = (b->field_4).field_0.uv_stride;
  local_80[2] = local_80[1];
  local_48 = (double)(0xff << ((char)in_bit_depth - 8U & 0x1f));
  bVar3 = (char)bit_depth - (char)in_bit_depth;
  uVar15 = 0;
  uVar4 = 0;
  lVar12 = 0;
  local_40 = a;
  local_38 = psnr;
  do {
    uVar8 = local_80[lVar12 + 9];
    uVar7 = local_80[lVar12 + 6];
    if ((local_40->flags & 8) == 0) {
      uVar1 = get_sse(local_40->store_buf_adr[lVar12 + -4],local_80[lVar12 + 3],
                      b->store_buf_adr[lVar12 + -4],local_80[lVar12],uVar8,uVar7);
    }
    else if (bit_depth == (uint32_t)local_50) {
      uVar1 = highbd_get_sse(local_40->store_buf_adr[lVar12 + -4],local_80[lVar12 + 3],
                             b->store_buf_adr[lVar12 + -4],local_80[lVar12],uVar8,uVar7);
    }
    else if ((int)uVar7 < 1) {
      uVar1 = 0;
    }
    else {
      lVar6 = (long)b->store_buf_adr[lVar12 + -4] * 2;
      lVar9 = (long)local_40->store_buf_adr[lVar12 + -4] * 2;
      uVar10 = 0;
      uVar1 = 0;
      do {
        if (0 < (int)uVar8) {
          uVar11 = 0;
          do {
            lVar5 = (long)(int)((uint)(*(ushort *)(lVar9 + uVar11 * 2) >> (bVar3 & 0x1f)) -
                               (uint)(*(ushort *)(lVar6 + uVar11 * 2) >> (bVar3 & 0x1f)));
            uVar1 = uVar1 + lVar5 * lVar5;
            uVar11 = uVar11 + 1;
          } while (uVar8 != uVar11);
        }
        uVar10 = uVar10 + 1;
        lVar6 = lVar6 + (long)(int)local_80[lVar12] * 2;
        lVar9 = lVar9 + (long)(int)local_80[lVar12 + 3] * 2;
      } while (uVar10 != uVar7);
    }
    pPVar13 = local_38;
    uVar7 = uVar7 * uVar8;
    local_38->sse[lVar12 + 1] = uVar1;
    local_38->samples[lVar12 + 1] = uVar7;
    dVar17 = 100.0;
    if (uVar1 != 0) {
      auVar19._8_4_ = (int)(uVar1 >> 0x20);
      auVar19._0_8_ = uVar1;
      auVar19._12_4_ = 0x45300000;
      dVar16 = log10(((double)uVar7 * local_48 * local_48) /
                     ((auVar19._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
      dVar17 = 100.0;
      if (dVar16 * 10.0 <= 100.0) {
        dVar17 = dVar16 * 10.0;
      }
    }
    pYVar14 = local_40;
    lVar6 = lVar12 + 1;
    pPVar13->psnr[lVar12 + 1] = dVar17;
    uVar15 = uVar15 + uVar1;
    uVar4 = uVar4 + uVar7;
    lVar12 = lVar6;
  } while (lVar6 != 3);
  pPVar13->sse[0] = uVar15;
  pPVar13->samples[0] = uVar4;
  if (uVar15 == 0) {
    dVar17 = 100.0;
  }
  else {
    auVar20._8_4_ = (int)(uVar15 >> 0x20);
    auVar20._0_8_ = uVar15;
    auVar20._12_4_ = 0x45300000;
    dVar16 = log10(((double)uVar4 * local_48 * local_48) /
                   ((auVar20._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0)));
    dVar17 = 100.0;
    if (dVar16 * 10.0 <= 100.0) {
      dVar17 = dVar16 * 10.0;
    }
  }
  pPVar13->psnr[0] = dVar17;
  if (((uint)local_50 < bit_depth) && ((pYVar14->flags & 8U) != 0)) {
    dVar17 = (double)(0xff << ((char)bit_depth - 8U & 0x1f));
    lVar12 = 0;
    uVar15 = 0;
    uVar4 = 0;
    do {
      width = *(int *)((long)local_80 + lVar12 + 0x24);
      height = *(int *)((long)local_80 + lVar12 + 0x18);
      uVar8 = height * width;
      iVar2 = highbd_get_sse(*(uint8_t **)((long)pYVar14->store_buf_adr + lVar12 * 2 + -0x20),
                             *(int *)((long)local_80 + lVar12 + 0xc),
                             *(uint8_t **)((long)b->store_buf_adr + lVar12 * 2 + -0x20),
                             *(int *)((long)local_80 + lVar12),width,height);
      *(int64_t *)((long)pPVar13->sse_hbd + lVar12 * 2 + 8) = iVar2;
      *(uint *)((long)pPVar13->samples_hbd + lVar12 + 4) = uVar8;
      dVar16 = 100.0;
      if (iVar2 != 0) {
        auVar21._8_4_ = (int)((ulong)iVar2 >> 0x20);
        auVar21._0_8_ = iVar2;
        auVar21._12_4_ = 0x45300000;
        dVar18 = log10(((double)uVar8 * dVar17 * dVar17) /
                       ((auVar21._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)iVar2) - 4503599627370496.0)));
        dVar16 = 100.0;
        if (dVar18 * 10.0 <= 100.0) {
          dVar16 = dVar18 * 10.0;
        }
      }
      pPVar13 = local_38;
      *(double *)((long)local_38->psnr_hbd + lVar12 * 2 + 8) = dVar16;
      uVar15 = uVar15 + iVar2;
      uVar4 = uVar4 + uVar8;
      lVar12 = lVar12 + 4;
      pYVar14 = local_40;
    } while (lVar12 != 0xc);
    local_38->sse_hbd[0] = uVar15;
    local_38->samples_hbd[0] = uVar4;
    if (uVar15 == 0) {
      dVar17 = 100.0;
    }
    else {
      auVar22._8_4_ = (int)(uVar15 >> 0x20);
      auVar22._0_8_ = uVar15;
      auVar22._12_4_ = 0x45300000;
      dVar16 = log10(((double)uVar4 * dVar17 * dVar17) /
                     ((auVar22._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0)));
      dVar17 = 100.0;
      if (dVar16 * 10.0 <= 100.0) {
        dVar17 = dVar16 * 10.0;
      }
    }
    pPVar13->psnr_hbd[0] = dVar17;
  }
  return;
}

Assistant:

void aom_calc_highbd_psnr(const YV12_BUFFER_CONFIG *a,
                          const YV12_BUFFER_CONFIG *b, PSNR_STATS *psnr,
                          uint32_t bit_depth, uint32_t in_bit_depth) {
  assert(a->y_crop_width == b->y_crop_width);
  assert(a->y_crop_height == b->y_crop_height);
  assert(a->uv_crop_width == b->uv_crop_width);
  assert(a->uv_crop_height == b->uv_crop_height);
  const int widths[3] = { a->y_crop_width, a->uv_crop_width, a->uv_crop_width };
  const int heights[3] = { a->y_crop_height, a->uv_crop_height,
                           a->uv_crop_height };
  const int a_strides[3] = { a->y_stride, a->uv_stride, a->uv_stride };
  const int b_strides[3] = { b->y_stride, b->uv_stride, b->uv_stride };
  int i;
  uint64_t total_sse = 0;
  uint32_t total_samples = 0;
#if CONFIG_LIBVMAF_PSNR_PEAK
  double peak = (double)(255 << (in_bit_depth - 8));
#else
  double peak = (double)((1 << in_bit_depth) - 1);
#endif  // CONFIG_LIBVMAF_PSNR_PEAK
  const unsigned int input_shift = bit_depth - in_bit_depth;

  for (i = 0; i < 3; ++i) {
    const int w = widths[i];
    const int h = heights[i];
    const uint32_t samples = w * h;
    uint64_t sse;
    if (a->flags & YV12_FLAG_HIGHBITDEPTH) {
      if (input_shift) {
        sse = highbd_get_sse_shift(a->buffers[i], a_strides[i], b->buffers[i],
                                   b_strides[i], w, h, input_shift);
      } else {
        sse = highbd_get_sse(a->buffers[i], a_strides[i], b->buffers[i],
                             b_strides[i], w, h);
      }
    } else {
      sse = get_sse(a->buffers[i], a_strides[i], b->buffers[i], b_strides[i], w,
                    h);
    }
    psnr->sse[1 + i] = sse;
    psnr->samples[1 + i] = samples;
    psnr->psnr[1 + i] = aom_sse_to_psnr(samples, peak, (double)sse);

    total_sse += sse;
    total_samples += samples;
  }

  psnr->sse[0] = total_sse;
  psnr->samples[0] = total_samples;
  psnr->psnr[0] =
      aom_sse_to_psnr((double)total_samples, peak, (double)total_sse);

  // Compute PSNR based on stream bit depth
  if ((a->flags & YV12_FLAG_HIGHBITDEPTH) && (in_bit_depth < bit_depth)) {
#if CONFIG_LIBVMAF_PSNR_PEAK
    peak = (double)(255 << (bit_depth - 8));
#else
    peak = (double)((1 << bit_depth) - 1);
#endif  // CONFIG_LIBVMAF_PSNR_PEAK
    total_sse = 0;
    total_samples = 0;
    for (i = 0; i < 3; ++i) {
      const int w = widths[i];
      const int h = heights[i];
      const uint32_t samples = w * h;
      uint64_t sse;
      sse = highbd_get_sse(a->buffers[i], a_strides[i], b->buffers[i],
                           b_strides[i], w, h);
      psnr->sse_hbd[1 + i] = sse;
      psnr->samples_hbd[1 + i] = samples;
      psnr->psnr_hbd[1 + i] = aom_sse_to_psnr(samples, peak, (double)sse);
      total_sse += sse;
      total_samples += samples;
    }

    psnr->sse_hbd[0] = total_sse;
    psnr->samples_hbd[0] = total_samples;
    psnr->psnr_hbd[0] =
        aom_sse_to_psnr((double)total_samples, peak, (double)total_sse);
  }
}